

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * kratos::strip_newline(string *__return_storage_ptr__,string *str)

{
  long lVar1;
  size_type pos;
  string *str_local;
  
  while( true ) {
    lVar1 = std::__cxx11::string::find((char)str,10);
    if (lVar1 == -1) break;
    std::__cxx11::string::erase((ulong)str,(ulong)(lVar1 != -1));
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string strip_newline(std::string &str) {
    std::string::size_type pos = 0;
    while ((pos = str.find('\n', pos) != std::string::npos)) str.erase(pos, 1);
    return str;
}